

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transfer_Control_Request_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Transfer_Control_Request_PDU::Encode
          (Transfer_Control_Request_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pRVar3;
  KDataStream local_50;
  __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Transfer_Control_Request_PDU *this_local;
  
  Simulation_Management_Header::Encode(&this->super_Simulation_Management_Header,stream);
  pKVar2 = KDataStream::operator<<(stream,this->m_ui32ReqID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8ReqRelSrv);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8TrnTyp);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,(DataTypeBase *)&this->m_TrnsEntID);
  KDataStream::operator<<(pKVar2,this->m_ui32NumRecSets);
  citrEnd = std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::
            begin(&this->m_vRecs);
  local_28._M_current =
       (RecordSet *)
       std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::end
                 (&this->m_vRecs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
             ::operator->(&citrEnd);
    (*(pRVar3->super_DataTypeBase)._vptr_DataTypeBase[4])();
    KDataStream::operator<<(stream,&local_50);
    KDataStream::~KDataStream(&local_50);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Transfer_Control_Request_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << m_ui32ReqID
           << m_ui8ReqRelSrv
           << m_ui8TrnTyp
           << KDIS_STREAM m_TrnsEntID
           << m_ui32NumRecSets;

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << citr->Encode();
    }
}